

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void OPL_STATUS_SET(FM_OPL *OPL,int flag)

{
  int flag_local;
  FM_OPL *OPL_local;
  
  OPL->status = OPL->status | (byte)flag;
  if ((((OPL->status & 0x80) == 0) && ((OPL->status & OPL->statusmask) != 0)) &&
     (OPL->status = OPL->status | 0x80, OPL->IRQHandler != (OPL_IRQHANDLER)0x0)) {
    (*OPL->IRQHandler)(OPL->IRQParam,'\x01');
  }
  return;
}

Assistant:

INLINE void OPL_STATUS_SET(FM_OPL *OPL,int flag)
{
	/* set status flag */
	OPL->status |= flag;
	if(!(OPL->status & 0x80))
	{
		if(OPL->status & OPL->statusmask)
		{	/* IRQ on */
			OPL->status |= 0x80;
			/* callback user interrupt handler (IRQ is OFF to ON) */
			if(OPL->IRQHandler) (OPL->IRQHandler)(OPL->IRQParam,1);
		}
	}
}